

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void server::_doflagrun(clientinfo *ci,int timeused)

{
  bool bVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  stringformatter local_140;
  string msg;
  
  iVar3 = DAT_00194cdc;
  iVar5 = gamemode;
  if (timeused < 0x1f5) {
    pcVar6 = colorname(ci);
    out(3,"\f0%s \f7scored a \f6MEGARUN!",pcVar6);
    return;
  }
  if (serverflagruns == 0) {
    return;
  }
  lVar9 = (long)DAT_00194cdc;
  lVar10 = lVar9;
  puVar12 = _flagruns;
  if (lVar9 < 1) {
    puVar12 = (undefined8 *)0x0;
  }
  else {
    do {
      if ((*(int *)(puVar12 + 1) == iVar5) &&
         (iVar4 = strcmp((char *)*puVar12,&smapname), iVar4 == 0)) goto LAB_00134b7f;
      lVar10 = lVar10 + -1;
      puVar12 = puVar12 + 4;
    } while (lVar10 != 0);
    puVar12 = (undefined8 *)0x0;
  }
LAB_00134b7f:
  puVar11 = puVar12;
  if (puVar12 == (undefined8 *)0x0) {
    if (0x3ff < iVar3) {
      return;
    }
    vector<server::_flagrun>::add((vector<server::_flagrun> *)&_flagruns);
    sVar7 = strlen(&smapname);
    pcVar6 = (char *)operator_new__(sVar7 + 1);
    strncpy(pcVar6,&smapname,sVar7 + 1);
    pcVar6[sVar7] = '\0';
    puVar2 = _flagruns;
    puVar11 = _flagruns + lVar9 * 4;
    _flagruns[lVar9 * 4] = pcVar6;
    *(int *)(puVar2 + lVar9 * 4 + 1) = gamemode;
    sVar7 = strlen(ci->name);
    pcVar6 = (char *)operator_new__(sVar7 + 1);
    strncpy(pcVar6,ci->name,sVar7 + 1);
    pcVar6[sVar7] = '\0';
    puVar2[lVar9 * 4 + 2] = pcVar6;
    *(int *)(puVar2 + lVar9 * 4 + 3) = timeused;
  }
  if (puVar12 == (undefined8 *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = timeused <= *(int *)(puVar11 + 3);
  }
  if (bVar1) {
    _newflagrun = 1;
    pcVar6 = ci->name;
    pcVar8 = (char *)puVar11[2];
    iVar5 = strcmp(pcVar6,pcVar8);
    if (iVar5 != 0) {
      if (pcVar8 != (char *)0x0) {
        operator_delete__(pcVar8);
        puVar11[2] = 0;
      }
      sVar7 = strlen(pcVar6);
      pcVar8 = (char *)operator_new__(sVar7 + 1);
      strncpy(pcVar8,pcVar6,sVar7 + 1);
      pcVar8[sVar7] = '\0';
      puVar11[2] = pcVar8;
    }
    *(int *)(puVar11 + 3) = timeused;
    if (bVar1) {
      local_140.buf = msg;
      pcVar6 = colorname(ci);
      stringformatter::operator()
                (&local_140,"\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best\f7)",pcVar6
                 ,(ulong)(uint)timeused / 1000,(ulong)((uint)timeused % 1000) / 10);
      goto LAB_00134dde;
    }
  }
  local_140.buf = msg;
  pcVar6 = colorname(ci);
  stringformatter::operator()
            (&local_140,
             "\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best: \f0%s \f7%i.%02i\f7)",
             pcVar6,(ulong)(uint)timeused / 1000,(ulong)((uint)timeused % 1000) / 10,puVar11[2],
             (ulong)(uint)(*(int *)(puVar11 + 3) / 1000),
             (ulong)(uint)((*(int *)(puVar11 + 3) % 1000) / 10));
LAB_00134dde:
  sendf(-1,1,"ris",0x23,msg);
  return;
}

Assistant:

void _doflagrun(clientinfo *ci, int timeused)
    {
        if(timeused <= 500)
        {
            out(ECHO_SERV, "\f0%s \f7scored a \f6MEGARUN!", colorname(ci));
            return;
        }
        if(serverflagruns)
        {
            _flagrun *fr = 0;
            loopv(_flagruns) if(_flagruns[i].gamemode == gamemode && !strcmp(_flagruns[i].map, smapname))
            { fr = &_flagruns[i]; break; }
            bool isbest = false;
            if(!fr)
            {
                isbest = true;
                int lastfr = _flagruns.length();
                if(lastfr >= 1024) return;
                _flagruns.add();
                _flagruns[lastfr].map = newstring(smapname);
                _flagruns[lastfr].gamemode = gamemode;
                _flagruns[lastfr].name = newstring(ci->name);
                _flagruns[lastfr].timeused = timeused;
                fr = &_flagruns[lastfr];
            }
            isbest = isbest || timeused <= fr->timeused;
            if(isbest)
            {
                _newflagrun = 1;
                if(strcmp(ci->name, fr->name))
                {
                    DELETEA(fr->name);
                    fr->name = newstring(ci->name);
                }
                fr->timeused = timeused;
            }
            string msg;
            if(isbest) formatstring(msg)("\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best\f7)",
                                         colorname(ci), timeused/1000, (timeused%1000)/10);
            else formatstring(msg)("\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best: \f0%s \f7%i.%02i\f7)",
                                   colorname(ci), timeused/1000, (timeused%1000)/10, fr->name, fr->timeused/1000, (fr->timeused%1000)/10);
            sendservmsg(msg);
        }
    }